

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O1

int pcre2_substring_list_get_16
              (pcre2_match_data_16 *match_data,PCRE2_UCHAR16 ***listptr,size_t **lengthsptr)

{
  undefined2 *puVar1;
  ulong uVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  PCRE2_UCHAR16 **ppPVar6;
  ulong uVar7;
  size_t sVar8;
  size_t *psVar9;
  uint uVar10;
  long lVar11;
  size_t *__dest;
  
  uVar10 = match_data->rc;
  uVar7 = (ulong)uVar10;
  if (-1 < (int)uVar10) {
    if (uVar10 == 0) {
      uVar7 = (ulong)match_data->oveccount;
    }
    iVar3 = (int)uVar7;
    sVar8 = 0x20;
    if (lengthsptr != (size_t **)0x0) {
      sVar8 = uVar7 * 8 + 0x20;
    }
    if (iVar3 != 0) {
      uVar5 = 0;
      do {
        lVar11 = (match_data->ovector[uVar5 + 1] - match_data->ovector[uVar5]) * 2;
        if (match_data->ovector[uVar5 + 1] <= match_data->ovector[uVar5]) {
          lVar11 = 0;
        }
        sVar8 = sVar8 + lVar11 + 10;
        uVar5 = uVar5 + 2;
      } while (uVar5 < (uint)(iVar3 * 2));
    }
    pvVar4 = _pcre2_memctl_malloc_16(sVar8,&match_data->memctl);
    if (pvVar4 == (void *)0x0) {
      uVar10 = 0xffffffd0;
    }
    else {
      ppPVar6 = (PCRE2_UCHAR16 **)((long)pvVar4 + 0x18);
      *listptr = ppPVar6;
      __dest = (size_t *)((long)pvVar4 + uVar7 * 8 + 0x20);
      if (lengthsptr == (size_t **)0x0) {
        psVar9 = (size_t *)0x0;
      }
      else {
        *lengthsptr = __dest;
        psVar9 = __dest;
        __dest = __dest + uVar7;
      }
      if (iVar3 != 0) {
        lVar11 = 0;
        uVar7 = 0;
        do {
          uVar5 = match_data->ovector[uVar7];
          uVar2 = match_data->ovector[uVar7 + 1];
          sVar8 = 0;
          if (uVar5 <= uVar2) {
            sVar8 = uVar2 - uVar5;
          }
          if (uVar5 <= uVar2 && uVar2 - uVar5 != 0) {
            memcpy(__dest,match_data->subject + uVar5,sVar8 * 2);
          }
          *(size_t **)((long)ppPVar6 + uVar7 * 4) = __dest;
          if (psVar9 == (size_t *)0x0) {
            psVar9 = (size_t *)0x0;
          }
          else {
            *psVar9 = sVar8;
            psVar9 = psVar9 + 1;
          }
          puVar1 = (undefined2 *)((long)__dest + sVar8 * 2);
          __dest = (size_t *)(puVar1 + 1);
          *puVar1 = 0;
          uVar7 = uVar7 + 2;
          lVar11 = lVar11 + 8;
        } while (uVar7 < (uint)(iVar3 * 2));
        ppPVar6 = (PCRE2_UCHAR16 **)((long)ppPVar6 + lVar11);
      }
      *ppPVar6 = (PCRE2_UCHAR16 *)0x0;
      uVar10 = 0;
    }
  }
  return uVar10;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_list_get(pcre2_match_data *match_data, PCRE2_UCHAR ***listptr,
  PCRE2_SIZE **lengthsptr)
{
int i, count, count2;
PCRE2_SIZE size;
PCRE2_SIZE *lensp;
pcre2_memctl *memp;
PCRE2_UCHAR **listp;
PCRE2_UCHAR *sp;
PCRE2_SIZE *ovector;

if ((count = match_data->rc) < 0) return count;   /* Match failed */
if (count == 0) count = match_data->oveccount;    /* Ovector too small */

count2 = 2*count;
ovector = match_data->ovector;
size = sizeof(pcre2_memctl) + sizeof(PCRE2_UCHAR *);      /* For final NULL */
if (lengthsptr != NULL) size += sizeof(PCRE2_SIZE) * count;  /* For lengths */

for (i = 0; i < count2; i += 2)
  {
  size += sizeof(PCRE2_UCHAR *) + CU2BYTES(1);
  if (ovector[i+1] > ovector[i]) size += CU2BYTES(ovector[i+1] - ovector[i]);
  }

memp = PRIV(memctl_malloc)(size, (pcre2_memctl *)match_data);
if (memp == NULL) return PCRE2_ERROR_NOMEMORY;

*listptr = listp = (PCRE2_UCHAR **)((char *)memp + sizeof(pcre2_memctl));
lensp = (PCRE2_SIZE *)((char *)listp + sizeof(PCRE2_UCHAR *) * (count + 1));

if (lengthsptr == NULL)
  {
  sp = (PCRE2_UCHAR *)lensp;
  lensp = NULL;
  }
else
  {
  *lengthsptr = lensp;
  sp = (PCRE2_UCHAR *)((char *)lensp + sizeof(PCRE2_SIZE) * count);
  }

for (i = 0; i < count2; i += 2)
  {
  size = (ovector[i+1] > ovector[i])? (ovector[i+1] - ovector[i]) : 0;

  /* Size == 0 includes the case when the capture is unset. Avoid adding
  PCRE2_UNSET to match_data->subject because it overflows, even though with
  zero size calling memcpy() is harmless. */

  if (size != 0) memcpy(sp, match_data->subject + ovector[i], CU2BYTES(size));
  *listp++ = sp;
  if (lensp != NULL) *lensp++ = size;
  sp += size;
  *sp++ = 0;
  }

*listp = NULL;
return 0;
}